

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

qsizetype QtPrivate::indexOf<QString,QStringBuilder<QLatin1String,QString&>>
                    (QList<QString> *vector,QStringBuilder<QLatin1String,_QString_&> *u,
                    qsizetype from)

{
  ulong uVar1;
  QString *pQVar2;
  long lVar3;
  char cVar4;
  qsizetype qVar5;
  ulong uVar6;
  qsizetype *pqVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (vector->d).size;
  uVar6 = from;
  if (from < 0) {
    uVar6 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar6 = 0;
    }
  }
  qVar5 = -1;
  if (uVar6 < uVar1) {
    pQVar2 = (vector->d).ptr;
    pqVar7 = &pQVar2[uVar6].d.size;
    lVar9 = uVar1 * 0x18 + uVar6 * -0x18;
    lVar3 = 0x18 - (long)(pQVar2 + uVar6);
    do {
      lVar8 = lVar3;
      if (lVar9 == 0) {
        qVar5 = -1;
        goto LAB_002bca86;
      }
      QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>(&local_50,u);
      lVar3 = *pqVar7;
      if (lVar3 == local_50.d.size) {
        QVar10.m_data = (char16_t *)pqVar7[-1];
        QVar10.m_size = lVar3;
        QVar11.m_data = local_50.d.ptr;
        QVar11.m_size = lVar3;
        cVar4 = QtPrivate::equalStrings(QVar10,QVar11);
      }
      else {
        cVar4 = '\0';
      }
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pqVar7 = pqVar7 + 3;
      lVar9 = lVar9 + -0x18;
      lVar3 = lVar8 + -0x18;
    } while (cVar4 == '\0');
    qVar5 = (-((long)&(vector->d).ptr[-1].d.d + lVar8) >> 3) * -0x5555555555555555;
  }
LAB_002bca86:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar5;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}